

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::EnumDescriptorProto_EnumReservedRange::InternalSerializeWithCachedSizesToArray
          (EnumDescriptorProto_EnumReservedRange *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  int32 iVar2;
  void *pvVar3;
  uint8 *local_28;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  local_28 = target;
  if ((uVar1 & 1) != 0) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_28);
    iVar2 = this->start_;
    *local_28 = '\b';
    local_28 = io::CodedOutputStream::WriteVarint32SignExtendedToArray(iVar2,local_28 + 1);
  }
  if ((uVar1 & 2) != 0) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_28);
    iVar2 = this->end_;
    *local_28 = '\x10';
    local_28 = io::CodedOutputStream::WriteVarint32SignExtendedToArray(iVar2,local_28 + 1);
  }
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    local_28 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                         ((UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe),local_28,stream);
  }
  return local_28;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* EnumDescriptorProto_EnumReservedRange::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.EnumDescriptorProto.EnumReservedRange)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional int32 start = 1;
  if (cached_has_bits & 0x00000001u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(1, this->_internal_start(), target);
  }

  // optional int32 end = 2;
  if (cached_has_bits & 0x00000002u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(2, this->_internal_end(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.EnumDescriptorProto.EnumReservedRange)
  return target;
}